

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O3

Reader * xLearn::CreateReader(char *format_name)

{
  Reader *pRVar1;
  allocator local_31;
  string local_30;
  
  if (GetRegistry_xLearn_reader_registry()::registry == '\0') {
    CreateReader();
  }
  std::__cxx11::string::string((string *)&local_30,format_name,&local_31);
  pRVar1 = ObjectCreatorRegistry_xLearn_reader_registry::CreateObject
                     ((ObjectCreatorRegistry_xLearn_reader_registry *)
                      GetRegistry_xLearn_reader_registry()::registry,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return pRVar1;
}

Assistant:

Reader* CreateReader(const char* format_name) {
  return CREATE_READER(format_name);
}